

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiowrt.c
# Opt level: O2

void fiowcls(osfildef *fp,errcxdef *ec,ulong respos)

{
  long __off;
  size_t sVar1;
  uint32_t tmp;
  char buf [4];
  
  __off = ftell((FILE *)fp);
  fseek((FILE *)fp,respos,0);
  sVar1 = fwrite(buf,4,1,(FILE *)fp);
  if (sVar1 == 1) {
    fseek((FILE *)fp,__off,0);
    return;
  }
  errsigf(ec,"TADS",0x259);
}

Assistant:

static void fiowcls(osfildef *fp, errcxdef *ec, ulong respos)
{
    ulong endpos;
    char  buf[4];
    
    endpos = osfpos(fp);
    osfseek(fp, respos, OSFSK_SET);
    oswp4(buf, endpos);
    if (osfwb(fp, buf, 4)) errsig(ec, ERR_WRTGAM);
    osfseek(fp, endpos, OSFSK_SET);
}